

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O0

void __thiscall
cs::statement_case::statement_case
          (statement_case *this,var *tag,
          deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *b,context_t *c,
          token_base *ptr)

{
  element_type *peVar1;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_RCX;
  undefined8 *in_RDI;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_R8;
  shared_ptr<cs::context_type> *in_stack_ffffffffffffff18;
  token_base *in_stack_ffffffffffffff20;
  shared_ptr<cs::context_type> *this_00;
  context_t *in_stack_ffffffffffffff28;
  statement_base *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff58;
  context_t *in_stack_ffffffffffffff60;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_ffffffffffffff68;
  statement_block *in_stack_ffffffffffffff70;
  EVP_PKEY_CTX local_40 [24];
  
  this_01 = (statement_base *)(local_40 + 8);
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  statement_base::statement_base(this_01,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x561637);
  *in_RDI = &PTR__statement_case_006bc3d8;
  cs_impl::any::any((any *)in_stack_ffffffffffffff20,(any *)in_stack_ffffffffffffff18);
  copy((EVP_PKEY_CTX *)(in_RDI + 4),local_40);
  cs_impl::any::~any((any *)0x56168b);
  this_00 = (shared_ptr<cs::context_type> *)(in_RDI + 5);
  peVar1 = (element_type *)statement_base::operator_new((size_t)this_00);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque(in_RCX,in_R8);
  std::shared_ptr<cs::context_type>::shared_ptr
            (this_00,(shared_ptr<cs::context_type> *)&stack0xffffffffffffff50);
  statement_block::statement_block
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             (token_base *)in_stack_ffffffffffffff58._M_pi);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x561705);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_ffffffffffffff70);
  (this_00->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar1;
  return;
}

Assistant:

statement_case(const var &tag, const std::deque<statement_base *> &b, const context_t &c, token_base *ptr)
			: statement_base(c, ptr), mTag(copy(tag)), mBlock(new statement_block(b, c, ptr)) {}